

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O0

bool __thiscall
cmDepends::Check(cmDepends *this,char *makeFile,char *internalFile,
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
                *validDeps)

{
  bool bVar1;
  uint uVar2;
  allocator local_289;
  string local_288;
  long local_258;
  ifstream fin;
  bool local_49;
  undefined1 local_48 [7];
  bool okay;
  cmWorkingDirectory workdir;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  *validDeps_local;
  char *internalFile_local;
  char *makeFile_local;
  cmDepends *this_local;
  
  workdir.OldDir.field_2._8_8_ = validDeps;
  cmWorkingDirectory::cmWorkingDirectory((cmWorkingDirectory *)local_48,&this->CompileDirectory);
  local_49 = true;
  std::ifstream::ifstream(&local_258,internalFile,_S_in);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)&local_258 + *(long *)(local_258 + -0x18)));
  if ((!bVar1) ||
     (uVar2 = (*this->_vptr_cmDepends[3])(this,&local_258,internalFile,workdir.OldDir.field_2._8_8_)
     , (uVar2 & 1) == 0)) {
    Clear(this,makeFile);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_288,internalFile,&local_289);
    cmsys::SystemTools::RemoveFile(&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator((allocator<char> *)&local_289);
    local_49 = false;
  }
  std::ifstream::~ifstream(&local_258);
  cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_48);
  return local_49;
}

Assistant:

bool cmDepends::Check(const char* makeFile, const char* internalFile,
                      std::map<std::string, DependencyVector>& validDeps)
{
  // Dependency checks must be done in proper working directory.
  cmWorkingDirectory workdir(this->CompileDirectory);

  // Check whether dependencies must be regenerated.
  bool okay = true;
  cmsys::ifstream fin(internalFile);
  if (!(fin && this->CheckDependencies(fin, internalFile, validDeps))) {
    // Clear all dependencies so they will be regenerated.
    this->Clear(makeFile);
    cmSystemTools::RemoveFile(internalFile);
    okay = false;
  }

  return okay;
}